

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O3

int ffgtvf(fitsfile *gfptr,long *firstfailed,int *status)

{
  long lVar1;
  int iVar2;
  long lVar3;
  char *__format;
  long lVar4;
  bool bVar5;
  fitsfile *fptr;
  long nmembers;
  long ngroups;
  char errstr [71];
  fitsfile *local_98;
  long local_90;
  long local_88;
  long local_80;
  char local_78 [72];
  
  local_90 = 0;
  local_80 = 0;
  local_98 = (fitsfile *)0x0;
  if (*status != 0) {
    return *status;
  }
  *firstfailed = 0;
  iVar2 = ffgtnm(gfptr,&local_90,status);
  *status = iVar2;
  if (local_90 < 1) {
    lVar3 = 1;
  }
  else {
    lVar1 = 1;
    do {
      lVar3 = lVar1;
      if (iVar2 != 0) goto LAB_001703fb;
      iVar2 = ffgmop(gfptr,lVar1,&local_98,status);
      *status = iVar2;
      ffclos(local_98,status);
      lVar3 = lVar1 + 1;
      iVar2 = *status;
      bVar5 = lVar1 < local_90;
      lVar1 = lVar3;
    } while (bVar5);
  }
  if (iVar2 == 0) {
    iVar2 = ffgmng(gfptr,&local_80,status);
    lVar1 = local_80;
    *status = iVar2;
    if (local_80 < 1) {
      lVar3 = 1;
    }
    else {
      local_88 = local_80 + 1;
      lVar4 = 1;
      do {
        lVar3 = lVar4;
        if (iVar2 != 0) goto LAB_001704ae;
        iVar2 = ffgtop(gfptr,(int)lVar4,&local_98,status);
        *status = iVar2;
        ffclos(local_98,status);
        iVar2 = *status;
        bVar5 = lVar4 != lVar1;
        lVar3 = local_88;
        lVar4 = lVar4 + 1;
      } while (bVar5);
    }
    if (iVar2 == 0) goto LAB_00170420;
LAB_001704ae:
    *firstfailed = -lVar3;
    __format = "Group table verify failed for GRPID index %ld (ffgtvf)";
  }
  else {
LAB_001703fb:
    *firstfailed = lVar3;
    __format = "Group table verify failed for member %ld (ffgtvf)";
  }
  snprintf(local_78,0x47,__format,lVar3);
  ffpmsg(local_78);
LAB_00170420:
  return *status;
}

Assistant:

int ffgtvf(fitsfile *gfptr,       /* FITS file pointer to group             */
	   long     *firstfailed, /* Member ID (if positive) of first failed
				     member HDU verify check or GRPID index
				     (if negitive) of first failed group
				     link verify check.                     */
	   int      *status)      /* return status code                     */

/*
 check the integrity of a grouping table to make sure that all group members 
 are accessible and all the links to other grouping tables are valid. The
 firstfailed parameter returns the member ID of the first member HDU to fail
 verification if positive or the first group link to fail if negative; 
 otherwise firstfailed contains a return value of 0.
*/

{
  long i;
  long nmembers = 0;
  long ngroups  = 0;

  char errstr[FLEN_VALUE];

  fitsfile *fptr = NULL;


  if(*status != 0) return(*status);

  *firstfailed = 0;

  do
    {
      /*
	attempt to open all the members of the grouping table. We stop
	at the first member which cannot be opened (which implies that it
	cannot be located)
      */

      *status = fits_get_num_members(gfptr,&nmembers,status);

      for(i = 1; i <= nmembers && *status == 0; ++i)
	{
	  *status = fits_open_member(gfptr,i,&fptr,status);
	  fits_close_file(fptr,status);
	}

      /*
	if the status is non-zero from the above loop then record the
	member index that caused the error
      */

      if(*status != 0)
	{
	  *firstfailed = i;
	  snprintf(errstr,FLEN_VALUE,"Group table verify failed for member %ld (ffgtvf)",
		  i);
	  ffpmsg(errstr);
	  continue;
	}

      /*
	attempt to open all the groups linked to this grouping table. We stop
	at the first group which cannot be opened (which implies that it
	cannot be located)
      */

      *status = fits_get_num_groups(gfptr,&ngroups,status);

      for(i = 1; i <= ngroups && *status == 0; ++i)
	{
	  *status = fits_open_group(gfptr,i,&fptr,status);
	  fits_close_file(fptr,status);
	}

      /*
	if the status from the above loop is non-zero, then record the
	GRPIDn index of the group that caused the failure
      */

      if(*status != 0)
	{
	  *firstfailed = -1*i;
	  snprintf(errstr,FLEN_VALUE,
		  "Group table verify failed for GRPID index %ld (ffgtvf)",i);
	  ffpmsg(errstr);
	  continue;
	}

    }while(0);

  return(*status);
}